

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O0

void ff_init_float(flexfloat_t *obj,float value,flexfloat_desc_t desc)

{
  undefined2 in_SI;
  double *in_RDI;
  float in_XMM0_Da;
  flexfloat_t *in_stack_00000030;
  
  *in_RDI = (double)in_XMM0_Da;
  *(undefined2 *)(in_RDI + 1) = in_SI;
  flexfloat_sanitize(in_stack_00000030);
  return;
}

Assistant:

INLINE void ff_init_float(flexfloat_t *obj, float value, flexfloat_desc_t desc) {
    obj->value = (fp_t)value;
    #ifdef FLEXFLOAT_TRACKING
    obj->exact_value = (fp_t)value;
    obj->tracking_fn = 0;
    obj->tracking_arg = 0;
    #endif
    obj->desc = desc;
    flexfloat_sanitize(obj);
}